

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O1

void __thiscall
vkt::image::anon_unknown_0::ImageStoreTestInstance::commandBeforeCompute
          (ImageStoreTestInstance *this,VkCommandBuffer cmdBuffer)

{
  VkImageSubresourceRange subresourceRange;
  DeviceInterface *pDVar1;
  VkBufferMemoryBarrier writeConstantsBarrier;
  VkImageMemoryBarrier setImageLayoutBarrier;
  
  pDVar1 = Context::getDeviceInterface
                     ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                      m_context);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount =
       (this->super_StoreTestInstance).super_BaseTestInstance.m_texture.m_numLayers;
  makeImageMemoryBarrier
            (&setImageLayoutBarrier,0,0,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)(((this->m_image).
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
                        m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange);
  makeBufferMemoryBarrier
            (&writeConstantsBarrier,0x4000,0x20,
             (VkBuffer)
             (((this->m_constantsBuffer).
               super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.
              ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
             ,0,(long)(this->super_StoreTestInstance).super_BaseTestInstance.m_texture.m_numLayers *
                this->m_constantsBufferChunkSizeBytes);
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,cmdBuffer,1,0x800,0,0,0,1,&writeConstantsBarrier,1,(int)&setImageLayoutBarrier);
  return;
}

Assistant:

void ImageStoreTestInstance::commandBeforeCompute (const VkCommandBuffer cmdBuffer)
{
	const DeviceInterface& vk = m_context.getDeviceInterface();

	const VkImageSubresourceRange fullImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, m_texture.numLayers());
	const VkImageMemoryBarrier setImageLayoutBarrier = makeImageMemoryBarrier(
		0u, 0u,
		VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
		m_image->get(), fullImageSubresourceRange);

	const VkDeviceSize constantsBufferSize = m_texture.numLayers() * m_constantsBufferChunkSizeBytes;
	const VkBufferMemoryBarrier writeConstantsBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT,
		m_constantsBuffer->get(), 0ull, constantsBufferSize);

	vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &writeConstantsBarrier, 1, &setImageLayoutBarrier);
}